

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

int __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::clone
          (SimpleFilteredSentenceBreakIterator *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  SimpleFilteredSentenceBreakIterator *this_00;
  undefined8 local_30;
  SimpleFilteredSentenceBreakIterator *this_local;
  
  this_00 = (SimpleFilteredSentenceBreakIterator *)
            UMemory::operator_new((UMemory *)0x160,(size_t)__fn);
  local_30 = (SimpleFilteredSentenceBreakIterator *)0x0;
  if (this_00 != (SimpleFilteredSentenceBreakIterator *)0x0) {
    SimpleFilteredSentenceBreakIterator(this_00,this);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

virtual BreakIterator* clone(void) const { return new SimpleFilteredSentenceBreakIterator(*this); }